

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

Symbol * __thiscall
ByteCodeGenerator::AddSymbolToScope
          (ByteCodeGenerator *this,Scope *scope,char16 *key,int keyLength,ParseNode *varDecl,
          SymbolType symbolType)

{
  Scope *pSVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodeVar *pPVar4;
  ParseNodeName *pPVar5;
  undefined4 *puVar6;
  Symbol *sym;
  
  if (varDecl->nop - 0x51 < 3) {
    pPVar4 = ParseNode::AsParseNodeVar(varDecl);
    sym = pPVar4->sym;
  }
  else if (varDecl->nop == knopName) {
    pPVar5 = ParseNode::AsParseNodeName(varDecl);
    if (pPVar5->symRef == (Symbol **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x704,"(varDecl->AsParseNodeName()->GetSymRef())",
                         "varDecl->AsParseNodeName()->GetSymRef()");
      if (!bVar3) goto LAB_00830fb6;
      *puVar6 = 0;
    }
    pPVar5 = ParseNode::AsParseNodeName(varDecl);
    sym = *pPVar5->symRef;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x708,"(0)","0");
    if (!bVar3) goto LAB_00830fb6;
    *puVar6 = 0;
    sym = (Symbol *)0x0;
  }
  if ((sym->scope != scope) && (sym->scope->scopeType != ScopeType_Parameter)) {
    if (1 < scope->scopeType - ScopeType_Global) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x714,
                         "(scope->GetScopeType() == ScopeType_Global || scope->GetScopeType() == ScopeType_GlobalEvalBlock)"
                         ,
                         "scope->GetScopeType() == ScopeType_Global || scope->GetScopeType() == ScopeType_GlobalEvalBlock"
                        );
      if (!bVar3) goto LAB_00830fb6;
      *puVar6 = 0;
    }
    Scope::AddNewSymbol(scope,sym);
  }
  pSVar1 = sym->scope;
  if ((pSVar1 == (Scope *)0x0) || ((pSVar1 != scope && (pSVar1->scopeType != ScopeType_Parameter))))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x718,
                       "(sym && sym->GetScope() && (sym->GetScope() == scope || sym->GetScope()->GetScopeType() == ScopeType_Parameter))"
                       ,
                       "sym && sym->GetScope() && (sym->GetScope() == scope || sym->GetScope()->GetScopeType() == ScopeType_Parameter)"
                      );
    if (!bVar3) {
LAB_00830fb6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if ((sym->field_0x44 & 0x40) != 0) {
    Scope::SetIsObject(scope);
  }
  return sym;
}

Assistant:

Symbol * ByteCodeGenerator::AddSymbolToScope(Scope *scope, const char16 *key, int keyLength, ParseNode *varDecl, SymbolType symbolType)
{
    Symbol *sym = nullptr;

    switch (varDecl->nop)
    {
    case knopConstDecl:
    case knopLetDecl:
    case knopVarDecl:
        sym = varDecl->AsParseNodeVar()->sym;
        break;
    case knopName:
        AnalysisAssert(varDecl->AsParseNodeName()->GetSymRef());
        sym = *varDecl->AsParseNodeName()->GetSymRef();
        break;
    default:
        AnalysisAssert(0);
        sym = nullptr;
        break;
    }

    if (sym->GetScope() != scope && sym->GetScope()->GetScopeType() != ScopeType_Parameter)
    {
        // This can happen when we have a function declared at global eval scope, and it has
        // references in deferred function bodies inside the eval. The BCG creates a new global scope
        // on such compiles, so we essentially have to migrate the symbol to the new scope.
        // We check fscrEvalCode, not fscrEval, because the same thing can happen in indirect eval,
        // when fscrEval is not set.
        Assert(scope->GetScopeType() == ScopeType_Global || scope->GetScopeType() == ScopeType_GlobalEvalBlock);
        scope->AddNewSymbol(sym);
    }

    Assert(sym && sym->GetScope() && (sym->GetScope() == scope || sym->GetScope()->GetScopeType() == ScopeType_Parameter));

    if (sym->NeedsScopeObject())
    {
        scope->SetIsObject();
    }

    return sym;
}